

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void save_position(Fl_Window *w,char *prefsName)

{
  int iVar1;
  uint uVar2;
  bool local_51;
  undefined1 local_30 [8];
  Fl_Preferences pos;
  char *prefsName_local;
  Fl_Window *w_local;
  
  pos.rootNode = (RootNode *)prefsName;
  Fl_Preferences::Fl_Preferences((Fl_Preferences *)local_30,&fluid_prefs,prefsName);
  iVar1 = Fl_Widget::x((Fl_Widget *)w);
  Fl_Preferences::set((Fl_Preferences *)local_30,"x",iVar1);
  iVar1 = Fl_Widget::y((Fl_Widget *)w);
  Fl_Preferences::set((Fl_Preferences *)local_30,"y",iVar1);
  iVar1 = Fl_Widget::w((Fl_Widget *)w);
  Fl_Preferences::set((Fl_Preferences *)local_30,"w",iVar1);
  iVar1 = Fl_Widget::h((Fl_Widget *)w);
  Fl_Preferences::set((Fl_Preferences *)local_30,"h",iVar1);
  iVar1 = Fl_Window::shown(w);
  local_51 = false;
  if (iVar1 != 0) {
    uVar2 = Fl_Widget::visible((Fl_Widget *)w);
    local_51 = uVar2 != 0;
  }
  Fl_Preferences::set((Fl_Preferences *)local_30,"visible",(uint)local_51);
  Fl_Preferences::~Fl_Preferences((Fl_Preferences *)local_30);
  return;
}

Assistant:

void save_position(Fl_Window *w, const char *prefsName) {
  Fl_Preferences pos(fluid_prefs, prefsName);
  pos.set("x", w->x());
  pos.set("y", w->y());
  pos.set("w", w->w());
  pos.set("h", w->h());
  pos.set("visible", (int)(w->shown() && w->visible()));
}